

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O0

void TPZShapeHDivConstantBound<pzshape::TPZShapePoint>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  long in_RSI;
  int64_t in_RDI;
  TPZFMatrix<double> *unaff_retaddr;
  
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RSI + 0x2c70),0);
  iVar1 = *piVar2;
  pdVar3 = TPZFMatrix<double>::operator()(unaff_retaddr,in_RDI,in_RSI);
  *pdVar3 = (double)iVar1;
  return;
}

Assistant:

void TPZShapeHDivConstantBound<class pzshape::TPZShapePoint>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {
    phi(0,0) = data.fSideOrient[0];
}